

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char **value)

{
  Message *in_RSI;
  AssertionResult *in_RDI;
  Message *in_stack_00000008;
  AssertionResult *in_stack_00000010;
  char **in_stack_ffffffffffffffb8;
  
  Message::Message(in_RSI);
  Message::operator<<((Message *)in_RDI,in_stack_ffffffffffffffb8);
  AppendMessage(in_stack_00000010,in_stack_00000008);
  Message::~Message((Message *)0x1963b8);
  return in_RDI;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }